

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O2

void __thiscall
TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
::~TPZParFrontStructMatrix
          (TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
           *this)

{
  ~TPZParFrontStructMatrix(this);
  operator_delete(this,0x270);
  return;
}

Assistant:

TPZParFrontStructMatrix<TFront,TVar,TPar>::~TPZParFrontStructMatrix()
{

}